

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

ly_bool set_values_equal_cb(void *val1_p,void *val2_p,ly_bool UNUSED_mod,void *UNUSED_cb_data)

{
  ly_bool lVar1;
  
  if ((*val1_p != *val2_p) ||
     (lVar1 = '\x01', *(int *)((long)val1_p + 8) != *(int *)((long)val2_p + 8))) {
    lVar1 = '\0';
  }
  return lVar1;
}

Assistant:

static ly_bool
set_values_equal_cb(void *val1_p, void *val2_p, ly_bool UNUSED(mod), void *UNUSED(cb_data))
{
    struct lyxp_set_hash_node *val1, *val2;

    val1 = (struct lyxp_set_hash_node *)val1_p;
    val2 = (struct lyxp_set_hash_node *)val2_p;

    if ((val1->node == val2->node) && (val1->type == val2->type)) {
        return 1;
    }

    return 0;
}